

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::vertex_attribfv(NegativeTestContext *ctx)

{
  GLuint index;
  float v [4];
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  index = NegativeTestContext::getInteger(ctx,0x8869);
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  glu::CallLogWrapper::glVertexAttrib1fv(&ctx->super_CallLogWrapper,index,(GLfloat *)&local_48);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttrib2fv(&ctx->super_CallLogWrapper,index,(GLfloat *)&local_48);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttrib3fv(&ctx->super_CallLogWrapper,index,(GLfloat *)&local_48);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttrib4fv(&ctx->super_CallLogWrapper,index,(GLfloat *)&local_48);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void vertex_attribfv (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	int maxVertexAttribs = ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);
	float v[4] = {0.0f};
	ctx.glVertexAttrib1fv(maxVertexAttribs, &v[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib2fv(maxVertexAttribs, &v[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib3fv(maxVertexAttribs, &v[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib4fv(maxVertexAttribs, &v[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}